

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

EC_POINT * x9_62_decode_point(EC_GROUP *group,ptls_iovec_t vec,BN_CTX *bn_ctx)

{
  int iVar1;
  BN_CTX *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  EC_GROUP *in_RDI;
  EC_POINT *point;
  EC_POINT *local_8;
  
  local_8 = EC_POINT_new(in_RDI);
  if (local_8 == (EC_POINT *)0x0) {
    local_8 = (EC_POINT *)0x0;
  }
  else {
    iVar1 = EC_POINT_oct2point(in_RDI,local_8,in_RSI,in_RDX,in_RCX);
    if (iVar1 == 0) {
      EC_POINT_free(local_8);
      local_8 = (EC_POINT *)0x0;
    }
  }
  return (EC_POINT *)local_8;
}

Assistant:

static EC_POINT *x9_62_decode_point(const EC_GROUP *group, ptls_iovec_t vec, BN_CTX *bn_ctx)
{
    EC_POINT *point = NULL;

    if ((point = EC_POINT_new(group)) == NULL)
        return NULL;
    if (!EC_POINT_oct2point(group, point, vec.base, vec.len, bn_ctx)) {
        EC_POINT_free(point);
        return NULL;
    }

    return point;
}